

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

quad_value_bit_vector *
bsim::quad_value_bit_vector_operations::lor
          (quad_value_bit_vector *__return_storage_ptr__,quad_value_bit_vector *a,
          quad_value_bit_vector *b)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  undefined8 in_RAX;
  uchar uVar4;
  long lVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,a->N);
  lVar5 = 0;
  do {
    if (a->N <= lVar5) {
      return __return_storage_ptr__;
    }
    bVar2 = (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar5].value;
    bVar3 = (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar5].value;
    uStack_38 = CONCAT26(CONCAT11(uStack_38._7_1_,bVar2),CONCAT15(bVar3,(undefined5)uStack_38));
    if (bVar2 == 3) {
      __assert_fail("!a.is_high_impedance()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                    ,0xb8,"quad_value bsim::operator|(const quad_value &, const quad_value &)");
    }
    if (bVar3 == 3) {
      __assert_fail("!b.is_high_impedance()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                    ,0xb9,"quad_value bsim::operator|(const quad_value &, const quad_value &)");
    }
    if (bVar2 < 2) {
      uVar1 = quad_value::binary_value((quad_value *)((long)&uStack_38 + 6));
      uVar4 = '\x01';
      if (uVar1 != '\x01') {
        bVar3 = uStack_38._5_1_;
        goto LAB_0014666b;
      }
    }
    else {
LAB_0014666b:
      if (bVar3 < 2) {
        uVar1 = quad_value::binary_value((quad_value *)((long)&uStack_38 + 5));
        uVar4 = '\x01';
        if (uVar1 == '\x01') goto LAB_001466cb;
      }
      uVar4 = '\x02';
      if ((uStack_38._6_1_ != 2) && (uStack_38._5_1_ != 2)) {
        if (1 < uStack_38._6_1_) {
          __assert_fail("a.is_binary()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0xc6,"quad_value bsim::operator|(const quad_value &, const quad_value &)");
        }
        if (1 < uStack_38._5_1_) {
          __assert_fail("b.is_binary()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,199,"quad_value bsim::operator|(const quad_value &, const quad_value &)");
        }
        bVar2 = quad_value::binary_value((quad_value *)((long)&uStack_38 + 6));
        bVar3 = quad_value::binary_value((quad_value *)((long)&uStack_38 + 5));
        quad_value::quad_value((quad_value *)((long)&uStack_38 + 7),bVar3 | bVar2);
        uVar4 = uStack_38._7_1_;
      }
    }
LAB_001466cb:
    (__return_storage_ptr__->bits).
    super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5].value = uVar4;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static inline quad_value_bit_vector lor(const quad_value_bit_vector& a,
					 const quad_value_bit_vector& b) {
      quad_value_bit_vector a_or_b(a.bitLength());
      for (int i = 0; i < a.bitLength(); i++) {
  	a_or_b.set(i, a.get(i) | b.get(i));
      }
      return a_or_b;
    }